

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O3

void __thiscall
AddressFixture_InitSegmentMaxOffsetMax_Test::~AddressFixture_InitSegmentMaxOffsetMax_Test
          (AddressFixture_InitSegmentMaxOffsetMax_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (AddressFixture, InitSegmentMaxOffsetMax) {
    constexpr auto segment = pstore::address::max_segment;
    constexpr auto offset = pstore::address::max_offset;

    auto const expected = this->expected_address (segment, offset);
    auto const actual = pstore::address{segment, offset};

    EXPECT_EQ (expected, actual);
    EXPECT_EQ (expected.absolute (), actual.absolute ());
    EXPECT_EQ (segment, actual.segment ());
    EXPECT_EQ (offset, actual.offset ());
}